

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2boolean_operation.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_bb64a::EdgeClippingLayer::Build(EdgeClippingLayer *this,Graph *g,S2Error *error)

{
  _func_int ***ppp_Var1;
  int iVar2;
  pointer piVar3;
  iterator iVar4;
  iterator iVar5;
  pointer pVVar6;
  pointer puVar7;
  __uniq_ptr_impl<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_> _Var8;
  bool bVar9;
  undefined1 auVar10 [16];
  undefined8 uVar11;
  undefined8 uVar12;
  S2Error *pSVar13;
  Graph *pGVar14;
  byte bVar15;
  bool bVar16;
  pointer ppVar17;
  pair<int,_int> pVar18;
  pointer piVar19;
  pointer pGVar20;
  pointer pGVar21;
  int *piVar22;
  const_reference pCVar23;
  long lVar24;
  pair<int,_int> pVar25;
  pair<int,_int> pVar26;
  ostream *poVar27;
  long lVar28;
  int iVar29;
  ulong uVar30;
  undefined8 *puVar31;
  pair<int,_int> pVar32;
  ulong uVar33;
  pair<int,_int> *ppVar34;
  Rep *pRVar35;
  CrossingInputEdge CVar36;
  InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>
  *__cur_1;
  ulong uVar37;
  InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>
  *pIVar38;
  GraphOptions *options;
  undefined1 uVar39;
  int iVar40;
  CrossingInputEdge CVar41;
  pointer pGVar42;
  InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>
  *pIVar43;
  uint uVar44;
  pointer ppVar45;
  uint uVar46;
  long lVar47;
  difference_type __d;
  vector<int,_std::allocator<int>_> *pvVar48;
  difference_type __n;
  ulong uVar49;
  long lVar50;
  pointer pGVar51;
  InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>
  *__cur;
  pointer pGVar52;
  undefined8 *puVar53;
  Rep *pRVar54;
  CrossingGraphEdgeVector *__range1;
  ulong uVar55;
  vector<int,_std::allocator<int>_> *pvVar56;
  InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>
  *this_00;
  double dVar57;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  int iVar62;
  undefined1 auVar61 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  vector<(anonymous_namespace)::CrossingInputEdge,_std::allocator<(anonymous_namespace)::CrossingInputEdge>_>
  b_input_edges;
  vector<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>,_std::allocator<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>_>_>
  b_edges;
  vector<int,_std::allocator<int>_> a_vertices;
  vector<int,_std::allocator<int>_> indegree;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> vmap;
  IdSetLexicon new_input_edge_id_set_lexicon;
  vector<int,_std::allocator<int>_> a_num_crossings;
  undefined8 auStackY_ea0 [10];
  long alStackY_e50 [347];
  CrossingInputEdge local_368;
  int local_364;
  pair<int,_int> *local_360;
  vector<int,_std::allocator<int>_> *local_358;
  int local_350;
  int local_34c;
  Graph *local_348;
  InputEdgeCrossings *pIStack_340;
  pointer local_338;
  ulong local_330;
  vector<int,_std::allocator<int>_> *local_328;
  InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>
  *local_320;
  undefined1 local_318 [16];
  pointer local_308;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> local_2f8;
  undefined1 local_2d8 [16];
  pointer local_2c8;
  EdgeClippingLayer *local_2c0;
  vector<int,_std::allocator<int>_> *local_2b8;
  int local_2ac;
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  undefined1 local_278 [16];
  undefined8 local_268;
  undefined1 local_258 [16];
  undefined1 local_248 [16];
  undefined1 local_238 [16];
  undefined1 local_228 [16];
  undefined8 local_218;
  vector<int,_std::allocator<int>_> local_208;
  pointer local_1e8;
  S2Error *local_1e0;
  ulong local_1d8;
  int local_1cc;
  undefined1 local_1c8 [16];
  pair<int,_int> *local_1b8;
  uint local_1b0;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *local_1a8;
  _Any_data local_180;
  _Manager_type local_170;
  GraphEdgeClipper local_160;
  char *local_b0;
  Graph *local_a8;
  allocator_type *local_a0;
  vector<int,_std::allocator<int>_> *local_98;
  long local_90;
  ulong local_88;
  long local_80;
  vector<int,_std::allocator<int>_> local_78 [3];
  
  local_2f8.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._0_16_ = ZEXT816(0);
  local_2f8.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._0_16_ =
       ZEXT816(0);
  local_348 = (Graph *)this->input_dimensions_;
  pIStack_340 = this->input_crossings_;
  local_2c0 = this;
  local_1e0 = error;
  local_160.g_ = g;
  S2Builder::Graph::VertexInMap::VertexInMap(&local_160.in_,g);
  S2Builder::Graph::VertexOutMap::VertexOutMap(&local_160.out_,g);
  pGVar14 = local_160.g_;
  local_160.input_dimensions_ = (vector<signed_char,_std::allocator<signed_char>_> *)local_348;
  local_160.input_crossings_ = pIStack_340;
  local_160.new_edges_ = &local_2f8;
  local_160.new_input_edge_ids_ = &local_208;
  local_358 = g->input_edge_id_set_ids_;
  local_160.input_ids_ = local_358;
  if (((local_160.g_)->options_).edge_type_ == DIRECTED) {
    if (((local_160.g_)->options_).duplicate_edges_ == KEEP) {
      if (((local_160.g_)->options_).sibling_pairs_ == KEEP) {
        S2Builder::Graph::GetInputEdgeOrder(&local_160.order_,local_160.g_,local_358);
        local_1c8._0_8_ = (_Bit_type *)0x0;
        local_1c8._8_4_ = 0;
        local_1c8._12_4_ = 0;
        local_1b8 = (pair<int,_int> *)0x0;
        local_348 = pGVar14;
        local_98 = (vector<int,_std::allocator<int>_> *)local_258;
        local_a0 = (allocator_type *)local_2a8;
        local_a8 = g;
        std::vector<int,_std::allocator<int>_>::vector
                  (local_98,(long)pGVar14->num_vertices_,local_a0);
        if ((long)local_160.order_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_160.order_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start != 0) {
          uVar30 = (long)local_160.order_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)local_160.order_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start >> 2;
          uVar55 = 0;
          uVar33 = 0;
          piVar19 = local_160.order_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          do {
            iVar29 = (int)uVar33;
            uVar49 = (ulong)iVar29;
            if (uVar49 < uVar30) {
              piVar3 = (local_358->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start;
              uVar37 = uVar49;
              do {
                uVar33 = uVar37;
                if (piVar3[piVar19[uVar37]] != piVar3[piVar19[uVar55]]) break;
                uVar37 = uVar37 + 1;
                uVar33 = uVar30;
              } while (uVar30 != uVar37);
            }
            iVar62 = (int)uVar33;
            iVar40 = iVar62 - iVar29;
            uVar55 = (ulong)iVar62;
            if (iVar40 != 1) {
              local_360 = (pair<int,_int> *)CONCAT44(local_360._4_4_,iVar29);
              if (iVar29 < iVar62) {
                ppVar17 = (local_348->edges_->
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          )._M_impl.super__Vector_impl_data._M_start;
                uVar30 = uVar49;
                do {
                  iVar29 = local_160.order_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[uVar30];
                  pVar18.second = iVar29;
                  pVar18.first = ppVar17[iVar29].first;
                  local_2a8._0_4_ = ppVar17[iVar29].first;
                  local_2a8._4_4_ = iVar29;
                  if ((pair<int,_int> *)local_1c8._8_8_ == local_1b8) {
                    std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
                    _M_realloc_insert<std::pair<int,int>>
                              ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
                               local_1c8,(iterator)local_1c8._8_8_,(pair<int,_int> *)local_2a8);
                  }
                  else {
                    *(pair<int,_int> *)local_1c8._8_8_ = pVar18;
                    local_1c8._8_8_ = (pair<int,_int> *)(local_1c8._8_8_ + 8);
                  }
                  ppVar17 = (local_348->edges_->
                            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                            )._M_impl.super__Vector_impl_data._M_start;
                  piVar22 = (int *)(local_258._0_8_ + (long)ppVar17[iVar29].second * 4);
                  *piVar22 = *piVar22 + 1;
                  uVar30 = uVar30 + 1;
                  iVar40 = iVar40 + -1;
                } while (iVar40 != 0);
              }
              uVar11 = local_1c8._0_8_;
              uVar12 = local_1c8._8_8_;
              if (local_1c8._0_8_ != local_1c8._8_8_) {
                uVar30 = (long)(local_1c8._8_8_ - local_1c8._0_8_) >> 3;
                lVar47 = 0x3f;
                if (uVar30 != 0) {
                  for (; uVar30 >> lVar47 == 0; lVar47 = lVar47 + -1) {
                  }
                }
                std::
                __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                          (local_1c8._0_8_,local_1c8._8_8_,((uint)lVar47 ^ 0x3f) * 2 ^ 0x7e);
                std::
                __final_insertion_sort<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,__gnu_cxx::__ops::_Iter_less_iter>
                          (uVar11,uVar12);
              }
              ppVar17 = (local_348->edges_->
                        super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                        )._M_impl.super__Vector_impl_data._M_start;
              uVar37 = (ulong)((long)(local_348->edges_->
                                     super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                     )._M_impl.super__Vector_impl_data._M_finish - (long)ppVar17) >>
                       3;
              iVar29 = (int)uVar37;
              uVar30 = uVar49;
              if ((int)local_360 < iVar62) {
                do {
                  uVar37 = uVar37 & 0xffffffff;
                  if (*(int *)(local_258._0_8_ +
                              (long)ppVar17[local_160.order_.
                                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                            super__Vector_impl_data._M_start[uVar30]].first * 4) ==
                      0) {
                    uVar37 = (ulong)(uint)local_160.order_.
                                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                          super__Vector_impl_data._M_start[uVar30];
                  }
                  iVar29 = (int)uVar37;
                  uVar30 = uVar30 + 1;
                } while (uVar55 != uVar30);
              }
              local_160.order_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar49] = iVar29;
              lVar47 = (long)ppVar17[iVar29].second;
              *(int *)(local_258._0_8_ + lVar47 * 4) = 0;
              lVar50 = uVar49 + 1;
              if (iVar62 != (int)lVar50) {
                do {
                  iVar29 = (int)lVar47;
                  uVar30 = (long)(local_1c8._8_8_ - local_1c8._0_8_) >> 3;
                  poVar27 = (ostream *)local_1c8._0_8_;
                  while (uVar49 = uVar30, 0 < (long)uVar49) {
                    uVar30 = uVar49 >> 1;
                    ppp_Var1 = &poVar27->_vptr_basic_ostream + uVar30;
                    if ((*(int *)ppp_Var1 < iVar29) ||
                       ((*(int *)ppp_Var1 <= iVar29 && (*(int *)((long)ppp_Var1 + 4) < 0)))) {
                      poVar27 = (ostream *)(ppp_Var1 + 1);
                      uVar30 = ~uVar30 + uVar49;
                    }
                  }
                  if (iVar29 != *(int *)&poVar27->_vptr_basic_ostream) {
                    S2LogMessage::S2LogMessage
                              ((S2LogMessage *)local_2a8,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2boolean_operation.cc"
                               ,0xeb,kFatal,(ostream *)&std::cerr);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_2a8._8_8_,"Check failed: (v) == (out->first) ",0x22)
                    ;
                    goto LAB_001a233c;
                  }
                  iVar29 = *(int *)((long)&poVar27->_vptr_basic_ostream + 4);
                  local_160.order_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar50] = iVar29;
                  lVar47 = (long)ppVar17[iVar29].second;
                  *(int *)(local_258._0_8_ + lVar47 * 4) = 0;
                  lVar50 = lVar50 + 1;
                } while (iVar62 != (int)lVar50);
              }
              piVar19 = local_160.order_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start;
              if (local_1c8._8_8_ != local_1c8._0_8_) {
                local_1c8._8_8_ = local_1c8._0_8_;
              }
            }
            uVar30 = (long)local_160.order_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish - (long)piVar19 >> 2;
          } while (uVar55 < uVar30);
        }
        if ((pair<int,_int>)local_258._0_8_ != (pair<int,_int>)0x0) {
          operator_delete((void *)local_258._0_8_);
        }
        if ((_Bit_type *)local_1c8._0_8_ != (_Bit_type *)0x0) {
          operator_delete((void *)local_1c8._0_8_);
        }
        std::vector<int,_std::allocator<int>_>::vector
                  (&local_160.rank_,
                   (long)local_160.order_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)local_160.order_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start >> 2,(allocator_type *)local_1c8);
        if ((long)local_160.order_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_160.order_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start != 0) {
          lVar47 = (long)local_160.order_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)local_160.order_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start >> 2;
          lVar50 = 0;
          do {
            local_160.rank_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start
            [local_160.order_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start[lVar50]] = (int)lVar50;
            lVar50 = lVar50 + 1;
          } while (lVar47 + (ulong)(lVar47 == 0) != lVar50);
        }
        local_2a8._0_4_ = kInfo;
        local_2a8._4_4_ = 0;
        local_2a8._8_8_ = (ostream *)0x0;
        auVar60._8_8_ = 0;
        auVar60._0_8_ = local_298._8_8_;
        local_298 = auVar60 << 0x40;
        local_78[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        local_78[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        local_78[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        local_1c8._0_12_ = ZEXT812(0);
        local_1b8 = (pair<int,_int> *)0x0;
        local_1b0 = 0;
        local_1a8 = (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)0x0;
        local_308 = (pointer)0x0;
        local_318 = (undefined1  [16])0x0;
        local_2c8 = (pointer)0x0;
        local_2d8 = (undefined1  [16])0x0;
        if (local_160.order_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_160.order_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start) {
          std::
          vector<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>,_std::allocator<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>_>_>
          ::~vector((vector<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>,_std::allocator<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>_>_>
                     *)local_2d8);
        }
        else {
          ppVar45 = ((local_160.input_crossings_)->
                    super__Vector_base<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>,_std::allocator<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          local_b0 = "vector::_M_realloc_insert";
          pGVar51 = (pointer)0x0;
          uVar33 = 0;
          local_368 = (CrossingInputEdge)0x0;
          local_88 = 0;
          local_1d8 = 0;
          local_34c = 0;
          do {
            local_348 = (Graph *)CONCAT44(local_348._4_4_,
                                          ((local_160.input_ids_)->
                                          super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                          super__Vector_impl_data._M_start
                                          [local_160.order_.
                                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                           super__Vector_impl_data._M_start[uVar33]]);
            ppVar34 = ((local_160.g_)->edges_->
                      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                      )._M_impl.super__Vector_impl_data._M_start +
                      local_160.order_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar33];
            local_318._8_8_ = pGVar51;
            pGVar42 = pGVar51;
            if (ppVar45 !=
                ((local_160.input_crossings_)->
                super__Vector_base<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>,_std::allocator<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>_>_>
                )._M_impl.super__Vector_impl_data._M_finish) {
              do {
                local_360 = ppVar34;
                CVar36 = local_368;
                if (ppVar45->first != (int)local_348) break;
                CVar41 = ppVar45->second;
                iVar29 = (int)CVar41 >> 1;
                uVar33 = local_1d8;
                if (iVar29 < 0) {
                  uVar30 = (ulong)(uint)CVar41;
                  if (((iVar29 != -2) && (CVar36 = CVar41, uVar30 = local_88, iVar29 != -1)) &&
                     (CVar36 = local_368, uVar33 = (ulong)(uint)CVar41, iVar29 != -3)) {
                    S2LogMessage::S2LogMessage
                              ((S2LogMessage *)local_258,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2boolean_operation.cc"
                               ,0x165,kFatal,(ostream *)&std::cerr);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_258._8_8_,
                               "Check failed: (next->second.input_id()) == (kSetReverseA) ",0x3a);
                    goto LAB_001a233c;
                  }
                }
                else if (pGVar51 == local_308) {
                  lVar47 = (long)pGVar51 - (long)pGVar42;
                  if (lVar47 == 0x7ffffffffffffffc) goto LAB_001a257f;
                  uVar30 = lVar47 >> 2;
                  uVar33 = uVar30;
                  if (pGVar51 == pGVar42) {
                    uVar33 = 1;
                  }
                  uVar55 = uVar33 + uVar30;
                  if (0x1ffffffffffffffe < uVar55) {
                    uVar55 = 0x1fffffffffffffff;
                  }
                  if (CARRY8(uVar33,uVar30)) {
                    uVar55 = 0x1fffffffffffffff;
                  }
                  pGVar20 = (pointer)operator_new(uVar55 * 4);
                  *(CrossingInputEdge *)((long)pGVar20 + lVar47) = ppVar45->second;
                  pGVar52 = pGVar20;
                  for (pGVar21 = pGVar42; pGVar51 != pGVar21;
                      pGVar21 = (pointer)&(pGVar21->options_).degenerate_edges_) {
                    (pGVar52->options_).edge_type_ = (pGVar21->options_).edge_type_;
                    pGVar52 = (pointer)&(pGVar52->options_).degenerate_edges_;
                  }
                  if (pGVar42 != (pointer)0x0) {
                    operator_delete(pGVar42);
                  }
                  pGVar51 = (pointer)&(pGVar52->options_).degenerate_edges_;
                  local_318._8_8_ = pGVar51;
                  local_318._0_8_ = pGVar20;
                  local_308 = (pointer)(&(pGVar20->options_).edge_type_ + uVar55);
                  pGVar42 = pGVar20;
                  uVar33 = local_1d8;
                  uVar30 = local_88;
                }
                else {
                  (pGVar51->options_).edge_type_ = (EdgeType)CVar41;
                  pGVar51 = (pointer)&(pGVar51->options_).degenerate_edges_;
                  local_318._8_8_ = pGVar51;
                  uVar30 = local_88;
                }
                local_88 = uVar30;
                local_1d8 = uVar33;
                ppVar45 = ppVar45 + 1;
                local_368 = CVar36;
                ppVar34 = local_360;
              } while (ppVar45 !=
                       ((local_160.input_crossings_)->
                       super__Vector_base<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>,_std::allocator<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish);
              ppVar34 = local_360;
              pGVar42 = (pointer)local_318._0_8_;
              local_368 = CVar36;
            }
            iVar29 = ppVar34->first;
            bVar15 = local_368._0_1_;
            if (iVar29 == ppVar34->second) {
              pVar18 = *ppVar34;
              local_258._0_4_ = pVar18.first;
              local_258._4_4_ = pVar18.second;
              local_364 = (int)local_348;
              iVar4._M_current = *(pair<int,_int> **)((long)local_160.new_edges_ + 8);
              if (iVar4._M_current == *(pair<int,_int> **)((long)local_160.new_edges_ + 0x10)) {
                std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
                _M_realloc_insert<std::pair<int,int>const&>
                          ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
                           local_160.new_edges_,iVar4,(pair<int,_int> *)local_258);
              }
              else {
                *iVar4._M_current = pVar18;
                *(long *)((long)local_160.new_edges_ + 8) =
                     *(long *)((long)local_160.new_edges_ + 8) + 8;
              }
              iVar5._M_current = *(int **)((long)local_160.new_input_edge_ids_ + 8);
              if (iVar5._M_current == *(int **)((long)local_160.new_input_edge_ids_ + 0x10)) {
                std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                          ((vector<int,std::allocator<int>> *)local_160.new_input_edge_ids_,iVar5,
                           &local_364);
              }
              else {
                *iVar5._M_current = (int)local_348;
                *(int **)((long)local_160.new_input_edge_ids_ + 8) = iVar5._M_current + 1;
              }
              local_368._1_3_ = 0;
              local_368._0_1_ =
                   ((uint)((ulong)((long)pGVar51 - (long)pGVar42) >> 2) & 1) != (uint)(bVar15 & 1);
              pGVar51 = pGVar42;
            }
            else if (pGVar42 == pGVar51) {
              pGVar51 = pGVar42;
              if (((uint)local_368 & 1) != 0) {
                if ((local_1d8 & 1) == 0) {
                  pVar32 = *ppVar34;
                }
                else {
                  pVar32.second = iVar29;
                  pVar32.first = ppVar34->second;
                }
                local_258._0_4_ = pVar32.first;
                local_258._4_4_ = pVar32.second;
                local_364 = (int)local_348;
                iVar4._M_current = *(pair<int,_int> **)((long)local_160.new_edges_ + 8);
                if (iVar4._M_current == *(pair<int,_int> **)((long)local_160.new_edges_ + 0x10)) {
                  std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
                  _M_realloc_insert<std::pair<int,int>const&>
                            ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
                             local_160.new_edges_,iVar4,(pair<int,_int> *)local_258);
                }
                else {
                  *iVar4._M_current = pVar32;
                  *(long *)((long)local_160.new_edges_ + 8) =
                       *(long *)((long)local_160.new_edges_ + 8) + 8;
                }
                iVar5._M_current = *(int **)((long)local_160.new_input_edge_ids_ + 8);
                if (iVar5._M_current == *(int **)((long)local_160.new_input_edge_ids_ + 0x10)) {
                  std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                            ((vector<int,std::allocator<int>> *)local_160.new_input_edge_ids_,iVar5,
                             &local_364);
                }
                else {
                  *iVar5._M_current = (int)local_348;
                  *(int **)((long)local_160.new_input_edge_ids_ + 8) = iVar5._M_current + 1;
                }
              }
            }
            else {
              pVar18 = (pair<int,_int>)local_2a8._8_8_;
              if (local_2a8._8_8_ != local_2a8._0_8_) {
                local_2a8._8_8_ = local_2a8._0_8_;
                pVar18 = (pair<int,_int>)local_2a8._0_8_;
              }
              local_1e8 = ppVar45;
              if (pVar18 == (pair<int,_int>)local_298._0_8_) {
                std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                          ((vector<int,std::allocator<int>> *)local_2a8,(iterator)pVar18,
                           &ppVar34->first);
              }
              else {
                *(int *)pVar18 = iVar29;
                local_2a8._8_8_ = (ostream *)((long)pVar18 + 4);
              }
              uVar11 = local_2d8._0_8_;
              uVar12 = local_2d8._8_8_;
              pIVar38 = (InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>
                         *)local_2d8._8_8_;
              pIVar43 = (InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>
                         *)local_2d8._0_8_;
              if (local_2d8._8_8_ != local_2d8._0_8_) {
                do {
                  absl::
                  InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>
                  ::~InlinedVector(pIVar43);
                  pIVar43 = pIVar43 + 1;
                } while (pIVar43 !=
                         (InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>
                          *)uVar12);
                local_2d8._8_8_ = uVar11;
                pIVar38 = (InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>
                           *)uVar11;
              }
              uVar30 = (long)pGVar51 - (long)pGVar42 >> 2;
              lVar50 = (long)pIVar38 - uVar11 >> 3;
              uVar33 = lVar50 * -0x3333333333333333;
              lVar47 = uVar33 - uVar30;
              local_338 = pGVar42;
              if (uVar30 <= uVar33) {
                if ((uVar30 <= uVar33 && lVar47 != 0) &&
                   (pIVar43 = (InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>
                               *)(uVar11 + uVar30 * 0x28), this_00 = pIVar43, pIVar38 != pIVar43)) {
                  do {
                    absl::
                    InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>
                    ::~InlinedVector(this_00);
                    this_00 = this_00 + 1;
                  } while (this_00 != pIVar38);
                  local_2d8._8_8_ = pIVar43;
                }
              }
              else {
                uVar30 = uVar30 + lVar50 * 0x3333333333333333;
                if (uVar30 != 0) {
                  if ((ulong)(((long)local_2c8 - (long)pIVar38 >> 3) * -0x3333333333333333) < uVar30
                     ) {
                    if (lVar50 * 0x3333333333333333 + 0x333333333333333U < uVar30) {
                      local_b0 = "vector::_M_default_append";
LAB_001a257f:
                      std::__throw_length_error(local_b0);
                    }
                    uVar55 = uVar30;
                    if (uVar30 <= uVar33 && uVar33 - uVar30 != 0) {
                      uVar55 = uVar33;
                    }
                    pvVar56 = (vector<int,_std::allocator<int>_> *)(uVar55 + uVar33);
                    if ((vector<int,_std::allocator<int>_> *)0x333333333333332 < pvVar56) {
                      pvVar56 = (vector<int,_std::allocator<int>_> *)0x333333333333333;
                    }
                    local_360 = (pair<int,_int> *)operator_new((long)pvVar56 * 0x28);
                    puVar53 = (undefined8 *)(((long)pIVar38 - uVar11) + (long)local_360);
                    lVar47 = uVar30 - 1;
                    auVar58._8_4_ = (int)lVar47;
                    auVar58._0_8_ = lVar47;
                    auVar58._12_4_ = (int)((ulong)lVar47 >> 0x20);
                    auVar58 = auVar58 ^ _DAT_00240670;
                    uVar33 = 0;
                    puVar31 = puVar53;
                    do {
                      auVar59._8_4_ = (int)uVar33;
                      auVar59._0_8_ = uVar33;
                      auVar59._12_4_ = (int)(uVar33 >> 0x20);
                      auVar60 = (auVar59 | _DAT_00240660) ^ _DAT_00240670;
                      auVar63._0_4_ = -(uint)(auVar58._0_4_ < auVar60._0_4_);
                      auVar63._4_4_ = -(uint)(auVar58._4_4_ < auVar60._4_4_);
                      auVar63._8_4_ = -(uint)(auVar58._8_4_ < auVar60._8_4_);
                      auVar63._12_4_ = -(uint)(auVar58._12_4_ < auVar60._12_4_);
                      iVar29 = -(uint)(auVar60._4_4_ == auVar58._4_4_);
                      iVar62 = -(uint)(auVar60._12_4_ == auVar58._12_4_);
                      auVar64._4_4_ = iVar29;
                      auVar64._0_4_ = iVar29;
                      auVar64._8_4_ = iVar62;
                      auVar64._12_4_ = iVar62;
                      auVar61._4_4_ = auVar63._4_4_;
                      auVar61._0_4_ = auVar63._4_4_;
                      auVar61._8_4_ = auVar63._12_4_;
                      auVar61._12_4_ = auVar63._12_4_;
                      auVar61 = auVar61 | auVar64 & auVar63;
                      if ((~auVar61._0_4_ & 1) != 0) {
                        *puVar31 = 0;
                      }
                      if (((auVar61 ^ _DAT_00240680) & (undefined1  [16])0x1) !=
                          (undefined1  [16])0x0) {
                        puVar31[5] = 0;
                      }
                      uVar33 = uVar33 + 2;
                      puVar31 = puVar31 + 10;
                    } while ((uVar30 + 1 & 0xfffffffffffffffe) != uVar33);
                    local_358 = pvVar56;
                    if ((InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>
                         *)uVar11 != pIVar38) {
                      ppVar34 = local_360 + 1;
                      pIVar43 = (InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>
                                 *)uVar11;
                      do {
                        pVar18 = (pair<int,_int>)(pIVar43->allocator_and_tag_).tag_.size_;
                        ppVar34[-1] = pVar18;
                        if (((ulong)pVar18 & 1) == 0) {
                          if (pVar18 != (pair<int,_int>)0x0) {
                            memcpy(ppVar34,&pIVar43->rep_,(long)pVar18 << 3);
                          }
                        }
                        else {
                          pVar18 = *(pair<int,_int> *)((long)&pIVar43->rep_ + 8);
                          *ppVar34 = *(pair<int,_int> *)&pIVar43->rep_;
                          ppVar34[1] = pVar18;
                          (pIVar43->allocator_and_tag_).tag_.size_ = 0;
                        }
                        absl::
                        InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>
                        ::~InlinedVector(pIVar43);
                        pIVar43 = pIVar43 + 1;
                        ppVar34 = ppVar34 + 5;
                      } while (pIVar43 != pIVar38);
                    }
                    if ((InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>
                         *)uVar11 !=
                        (InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>
                         *)0x0) {
                      operator_delete((void *)uVar11);
                    }
                    local_2d8._8_8_ = puVar53 + uVar30 * 5;
                    local_2d8._0_8_ = local_360;
                    local_2c8 = (pointer)(local_360 + (long)local_358 * 5);
                  }
                  else {
                    do {
                      (pIVar38->allocator_and_tag_).tag_.size_ = 0;
                      pIVar38 = pIVar38 + 1;
                      lVar47 = lVar47 + 1;
                    } while (lVar47 != 0);
                    local_2d8._8_8_ = pIVar38;
                  }
                }
              }
              GraphEdgeClipper::GatherIncidentEdges
                        (&local_160,(vector<int,_std::allocator<int>_> *)local_2a8,0,
                         (vector<(anonymous_namespace)::CrossingInputEdge,_std::allocator<(anonymous_namespace)::CrossingInputEdge>_>
                          *)local_318,
                         (vector<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>,_std::allocator<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>_>_>
                          *)local_2d8);
              uVar33 = (ulong)local_34c;
              if (uVar33 < (ulong)((long)local_160.order_.
                                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                         super__Vector_impl_data._M_finish -
                                   (long)local_160.order_.
                                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                         super__Vector_impl_data._M_start >> 2)) {
                do {
                  if (((local_160.input_ids_)->super__Vector_base<int,_std::allocator<int>_>).
                      _M_impl.super__Vector_impl_data._M_start
                      [local_160.order_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar33]] != (int)local_348) break;
                  piVar22 = &((local_160.g_)->edges_->
                             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                             )._M_impl.super__Vector_impl_data._M_start
                             [local_160.order_.super__Vector_base<int,_std::allocator<int>_>._M_impl
                              .super__Vector_impl_data._M_start[uVar33]].second;
                  if (local_2a8._8_8_ == local_298._0_8_) {
                    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                              ((vector<int,std::allocator<int>> *)local_2a8,
                               (iterator)local_2a8._8_8_,piVar22);
                    poVar27 = (ostream *)local_2a8._8_8_;
                  }
                  else {
                    *(int *)local_2a8._8_8_ = *piVar22;
                    poVar27 = (ostream *)(local_2a8._8_8_ + 4);
                    local_2a8._8_8_ = poVar27;
                  }
                  GraphEdgeClipper::GatherIncidentEdges
                            (&local_160,(vector<int,_std::allocator<int>_> *)local_2a8,
                             (int)((ulong)((long)poVar27 - local_2a8._0_8_) >> 2) + -1,
                             (vector<(anonymous_namespace)::CrossingInputEdge,_std::allocator<(anonymous_namespace)::CrossingInputEdge>_>
                              *)local_318,
                             (vector<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>,_std::allocator<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>_>_>
                              *)local_2d8);
                  uVar33 = uVar33 + 1;
                } while (uVar33 < (ulong)((long)local_160.order_.
                                                super__Vector_base<int,_std::allocator<int>_>.
                                                _M_impl.super__Vector_impl_data._M_finish -
                                          (long)local_160.order_.
                                                super__Vector_base<int,_std::allocator<int>_>.
                                                _M_impl.super__Vector_impl_data._M_start >> 2));
                local_34c = (int)uVar33;
              }
              if (s2builder_verbose == true) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"input edge ",0xb);
                poVar27 = (ostream *)std::ostream::operator<<(&std::cout,(int)local_348);
                std::__ostream_insert<char,std::char_traits<char>>(poVar27," (inside=",9);
                poVar27 = std::ostream::_M_insert<bool>(SUB81(poVar27,0));
                std::__ostream_insert<char,std::char_traits<char>>(poVar27,"):",2);
                uVar11 = local_2a8._8_8_;
                for (pVar18 = (pair<int,_int>)local_2a8._0_8_; pVar18 != (pair<int,_int>)uVar11;
                    pVar18 = (pair<int,_int>)((long)pVar18 + 4)) {
                  iVar29 = *(int *)pVar18;
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
                  std::ostream::operator<<(&std::cout,iVar29);
                }
              }
              if (local_78[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish !=
                  local_78[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start) {
                local_78[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     local_78[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
              }
              std::vector<int,_std::allocator<int>_>::resize
                        (local_78,(long)(local_2a8._8_8_ - local_2a8._0_8_) >> 2);
              pGVar51 = local_338;
              local_1b8 = (pair<int,_int> *)local_1c8._0_8_;
              local_1b0 = 0;
              std::vector<bool,_std::allocator<bool>_>::resize
                        ((vector<bool,_std::allocator<bool>_> *)local_1c8,
                         (long)(local_2a8._8_8_ - local_2a8._0_8_) >> 2,false);
              local_80 = (long)(int)local_348;
              local_34c = local_34c + -1;
              uVar33 = 0;
              do {
                if (local_2a8._0_8_ == local_2a8._8_8_) {
                  S2LogMessage::S2LogMessage
                            ((S2LogMessage *)local_258,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2boolean_operation.cc"
                             ,0x218,kFatal,(ostream *)&std::cerr);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_258._8_8_,"Check failed: !a.empty() ",0x19);
                  goto LAB_001a233c;
                }
                local_338 = (pointer)(uVar33 * 5);
                pIVar38 = (InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>
                           *)(local_2d8._0_8_ + uVar33 * 0x28);
                uVar30 = (pIVar38->allocator_and_tag_).tag_.size_;
                if (uVar30 < 2) {
                  S2LogMessage::S2LogMessage
                            ((S2LogMessage *)local_258,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2boolean_operation.cc"
                             ,0x219,kFatal,(ostream *)&std::cerr);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_258._8_8_,"Check failed: !b.empty() ",0x19);
                  goto LAB_001a233c;
                }
                uVar39 = (undefined1)(&(pGVar51->options_).edge_type_)[uVar33];
                uVar55 = local_2a8._8_8_ - local_2a8._0_8_;
                pvVar56 = (vector<int,_std::allocator<int>_> *)0x0;
                iVar29 = (int)(uVar55 >> 2);
                if (iVar29 != 1) {
                  local_360 = (pair<int,_int> *)CONCAT71(local_360._1_7_,uVar39);
                  pRVar54 = &pIVar38->rep_;
                  pRVar35 = pRVar54;
                  if ((uVar30 & 1) != 0) {
                    pRVar35 = *(Rep **)((long)&pIVar38->rep_ + 8);
                  }
                  iVar62 = *(int *)((long)pRVar35 + 4);
                  pCVar23 = absl::
                            InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>
                            ::back(pIVar38);
                  uVar30 = (pIVar38->allocator_and_tag_).tag_.size_;
                  if (iVar62 == pCVar23->a_index) {
                    if (uVar30 < 2) {
LAB_001a2551:
                      __assert_fail("i < size()",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/third_party/absl/container/inlined_vector.h"
                                    ,0xf8,
                                    "const_reference absl::InlinedVector<(anonymous namespace)::CrossingGraphEdge, 2>::operator[](size_type) const [T = (anonymous namespace)::CrossingGraphEdge, N = 2, A = std::allocator<(anonymous namespace)::CrossingGraphEdge>]"
                                   );
                    }
                    if ((uVar30 & 1) != 0) {
                      pRVar54 = *(Rep **)((long)&pIVar38->rep_ + 8);
                    }
                    pvVar56 = (vector<int,_std::allocator<int>_> *)
                              (ulong)*(uint *)((long)pRVar54 + 4);
                    uVar39 = local_360._0_1_;
LAB_001a162a:
                    if (-1 < (int)pvVar56) goto LAB_001a1633;
                  }
                  else {
                    if (uVar30 < 2) goto LAB_001a2551;
                    pRVar35 = pRVar54;
                    if ((uVar30 & 1) != 0) {
                      pRVar35 = *(Rep **)((long)&pIVar38->rep_ + 8);
                    }
                    local_2ac = (*(byte *)((long)pRVar35 + 8) ^ 1) +
                                local_160.rank_.super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_start[*(int *)pRVar35];
                    pCVar23 = absl::
                              InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>
                              ::back(pIVar38);
                    uVar30 = (pIVar38->allocator_and_tag_).tag_.size_;
                    pRVar35 = pRVar54;
                    if ((uVar30 & 1) != 0) {
                      pRVar35 = *(Rep **)((long)&pIVar38->rep_ + 8);
                    }
                    local_328 = (vector<int,_std::allocator<int>_> *)
                                ((ulong)((long)local_160.order_.
                                               super__Vector_base<int,_std::allocator<int>_>._M_impl
                                               .super__Vector_impl_data._M_finish -
                                        (long)local_160.order_.
                                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                              super__Vector_impl_data._M_start) >> 2);
                    piVar19 = local_160.rank_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start;
                    local_320 = pIVar38;
                    if (uVar30 < 2) {
                      iVar29 = -1;
                      iVar62 = (int)local_328;
                      uVar39 = local_360._0_1_;
                    }
                    else {
                      local_1cc = (pCVar23->outgoing ^ 1) +
                                  local_160.rank_.super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_start[pCVar23->id];
                      bVar9 = local_1cc < local_2ac;
                      lVar47 = (uVar30 >> 1) << 4;
                      local_350 = -1;
                      lVar50 = 0;
                      local_2b8 = (vector<int,_std::allocator<int>_> *)0xffffffff;
                      local_358 = (vector<int,_std::allocator<int>_> *)
                                  CONCAT44(local_358._4_4_,0xffffffff);
                      local_330 = uVar33;
                      local_90 = lVar47;
                      do {
                        iVar62 = *(int *)((long)pRVar35 + lVar50 + 4);
                        lVar24 = (long)iVar62;
                        if (lVar24 == 0) {
                          if (((bool)*(char *)((long)pRVar35 + lVar50 + 8) != bVar9) &&
                             (*(int *)((long)pRVar35 + lVar50 + 0xc) !=
                              *(int *)(local_2a8._0_8_ + 4))) {
                            local_2b8 = (vector<int,_std::allocator<int>_> *)
                                        (ulong)*(uint *)((long)pRVar35 + lVar50);
                          }
                        }
                        else if (iVar62 == iVar29 + -1) {
                          if (((bool)*(char *)((long)pRVar35 + lVar50 + 8) == bVar9) &&
                             (*(int *)((long)pRVar35 + lVar50 + 0xc) !=
                              *(int *)(local_2a8._0_8_ +
                                      ((long)(uVar55 * 0x40000000 + -0x200000000) >> 0x1e)))) {
                            local_358 = (vector<int,_std::allocator<int>_> *)
                                        CONCAT44(local_358._4_4_,
                                                 *(undefined4 *)((long)pRVar35 + lVar50));
                          }
                        }
                        else {
                          iVar62 = *(int *)((long)pRVar35 + lVar50 + 0xc);
                          iVar40 = *(int *)(local_2a8._0_8_ + -4 + lVar24 * 4);
                          if ((iVar62 != iVar40) &&
                             (iVar2 = *(int *)(local_2a8._0_8_ + 4 + lVar24 * 4), iVar62 != iVar2))
                          {
                            pVVar6 = ((local_160.g_)->vertices_->
                                     super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start;
                            bVar16 = s2pred::OrderedCCW(pVVar6 + iVar2,pVVar6 + iVar62,
                                                        pVVar6 + iVar40,
                                                        pVVar6 + *(int *)(local_2a8._0_8_ +
                                                                         lVar24 * 4));
                            uVar46 = local_160.rank_.super__Vector_base<int,_std::allocator<int>_>.
                                     _M_impl.super__Vector_impl_data._M_start
                                     [*(int *)((long)pRVar35 + lVar50)];
                            piVar19 = local_160.rank_.super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_start;
                            lVar47 = local_90;
                            if (((bVar16 ^ local_360._0_1_) & 1U) == 0) {
                              if (local_350 <= (int)(uVar46 + 1)) {
                                local_350 = uVar46 + 1;
                              }
                            }
                            else {
                              iVar62 = (int)local_328;
                              local_328 = (vector<int,_std::allocator<int>_> *)
                                          ((ulong)local_328 & 0xffffffff);
                              if ((int)uVar46 < iVar62) {
                                local_328 = (vector<int,_std::allocator<int>_> *)(ulong)uVar46;
                              }
                            }
                          }
                        }
                        lVar50 = lVar50 + 0x10;
                      } while (lVar47 != lVar50);
                      iVar62 = (int)local_328;
                      uVar33 = local_330;
                      pIVar38 = local_320;
                      iVar29 = local_350;
                      uVar39 = local_360._0_1_;
                      if (-1 < (int)local_2b8) {
                        if (-1 < (int)local_358) {
                          uVar30 = (local_320->allocator_and_tag_).tag_.size_;
                          pRVar35 = pRVar54;
                          if ((uVar30 & 1) != 0) {
                            pRVar35 = *(Rep **)((long)&local_320->rep_ + 8);
                          }
                          uVar55 = (ulong)((long)local_160.order_.
                                                 super__Vector_base<int,_std::allocator<int>_>.
                                                 _M_impl.super__Vector_impl_data._M_finish -
                                          (long)local_160.order_.
                                                super__Vector_base<int,_std::allocator<int>_>.
                                                _M_impl.super__Vector_impl_data._M_start) >> 2;
                          iVar40 = (int)uVar55;
                          uVar46 = 0xffffffff;
                          if (1 < uVar30) {
                            piVar22 = (int *)((long)pRVar35 + (uVar30 & 0xfffffffffffffffe) * 8);
                            uVar46 = 0xffffffff;
                            do {
                              uVar44 = (*(byte *)((long)pRVar35 + 8) ^ 1) + piVar19[*(int *)pRVar35]
                              ;
                              iVar40 = (int)uVar55;
                              uVar55 = uVar55 & 0xffffffff;
                              if ((int)uVar44 < iVar40) {
                                uVar55 = (ulong)uVar44;
                              }
                              iVar40 = (int)uVar55;
                              if ((int)uVar44 < (int)uVar46) {
                                uVar44 = uVar46;
                              }
                              uVar46 = uVar44;
                              pRVar35 = (Rep *)((long)pRVar35 + 0x10);
                            } while (pRVar35 != (Rep *)piVar22);
                          }
                          if ((local_350 <= iVar40) && ((int)uVar46 <= iVar62)) {
                            pvVar56 = local_358;
                            if (local_1cc < local_2ac) {
                              pvVar56 = local_2b8;
                            }
                            uVar30 = (ulong)pvVar56 & 0xffffffff;
                            if (local_1cc < local_2ac) {
                              local_2b8 = local_358;
                            }
                            local_2b8 = (vector<int,_std::allocator<int>_> *)
                                        ((ulong)local_2b8 & 0xffffffff);
                            local_258._0_4_ = kInfo;
                            local_258._4_4_ = 0;
                            local_258._8_8_ = (ostream *)0x0;
                            auVar10._8_8_ = 0;
                            auVar10._0_8_ = local_248._8_8_;
                            local_248 = auVar10 << 0x40;
                            lVar47 = (long)piVar19[(long)local_2b8];
                            if (piVar19[(long)local_2b8] < piVar19[uVar30]) {
                              do {
                                piVar22 = &((local_160.g_)->edges_->
                                           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                           )._M_impl.super__Vector_impl_data._M_start
                                           [local_160.order_.
                                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                            super__Vector_impl_data._M_start[lVar47]].second;
                                if (local_258._8_8_ == local_248._0_8_) {
                                  std::vector<int,std::allocator<int>>::
                                  _M_realloc_insert<int_const&>
                                            ((vector<int,std::allocator<int>> *)local_258,
                                             (iterator)local_258._8_8_,piVar22);
                                  piVar19 = local_160.rank_.
                                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                            super__Vector_impl_data._M_start;
                                }
                                else {
                                  *(int *)local_258._8_8_ = *piVar22;
                                  local_258._8_8_ = (ostream *)(local_258._8_8_ + 4);
                                }
                                lVar47 = lVar47 + 1;
                              } while (lVar47 < piVar19[uVar30]);
                            }
                            pIVar38 = local_320;
                            if (((local_160.g_)->edges_->
                                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                )._M_impl.super__Vector_impl_data._M_start[uVar30].second !=
                                *(int *)local_2a8._0_8_) {
                              pVar32 = (pair<int,_int>)(local_258._8_8_ + -4);
                              pVar18 = (pair<int,_int>)local_258._0_8_;
                              if ((ulong)local_258._0_8_ < (ulong)pVar32 &&
                                  local_258._0_8_ != local_258._8_8_) {
                                do {
                                  pVar25 = (pair<int,_int>)((long)pVar18 + 4);
                                  iVar29 = *(int *)pVar18;
                                  *(int *)pVar18 = *(int *)pVar32;
                                  *(int *)pVar32 = iVar29;
                                  pVar32 = (pair<int,_int>)((long)pVar32 + -4);
                                  pVar18 = pVar25;
                                } while ((ulong)pVar25 < (ulong)pVar32);
                              }
                            }
                            std::vector<int,std::allocator<int>>::
                            _M_range_insert<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
                                      ((vector<int,std::allocator<int>> *)local_258,local_258._8_8_,
                                       local_2a8._0_8_,local_2a8._8_8_);
                            lVar47 = 0;
                            bVar9 = true;
                            do {
                              bVar16 = bVar9;
                              std::vector<int,_std::allocator<int>_>::insert
                                        ((vector<int,_std::allocator<int>_> *)local_258,
                                         (const_iterator)local_258._8_8_,
                                         (value_type_conflict2 *)(lVar47 * 4 + local_258._0_8_));
                              uVar33 = local_330;
                              lVar47 = 1;
                              bVar9 = false;
                            } while (bVar16);
                            if ((ulong)(local_258._8_8_ - local_258._0_8_) < 9) {
                              bVar9 = false;
                            }
                            else {
                              pvVar56 = (vector<int,_std::allocator<int>_> *)0x0;
                              uVar55 = 2;
                              do {
                                pVVar6 = ((local_160.g_)->vertices_->
                                         super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>
                                         )._M_impl.super__Vector_impl_data._M_start;
                                local_358 = pvVar56;
                                dVar57 = S2::TurnAngle(pVVar6 + ((pointer)(local_258._0_8_ + -8))
                                                                [uVar55],
                                                       pVVar6 + ((pointer)(local_258._0_8_ + -4))
                                                                [uVar55],
                                                       pVVar6 + *(int *)(local_258._0_8_ +
                                                                        uVar55 * 4));
                                pvVar56 = (vector<int,_std::allocator<int>_> *)
                                          ((double)local_358 + dVar57);
                                uVar55 = uVar55 + 1;
                              } while (uVar55 < (ulong)((long)(local_258._8_8_ - local_258._0_8_) >>
                                                       2));
                              bVar9 = 0.0 < (double)pvVar56;
                              pIVar38 = local_320;
                            }
                            if ((pair<int,_int>)local_258._0_8_ != (pair<int,_int>)0x0) {
                              operator_delete((void *)local_258._0_8_);
                            }
                            piVar19 = local_160.rank_.super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_start;
                            iVar29 = local_350;
                            uVar39 = local_360._0_1_;
                            if (((bVar9 ^ local_360._0_1_) & UNDIRECTED) == DIRECTED) {
                              if (local_350 <=
                                  local_160.rank_.super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_start[uVar30] + 1) {
                                iVar29 = local_160.rank_.
                                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                         super__Vector_impl_data._M_start[uVar30] + 1;
                              }
                            }
                            else if (local_160.rank_.super__Vector_base<int,_std::allocator<int>_>.
                                     _M_impl.super__Vector_impl_data._M_start[(long)local_2b8] <
                                     iVar62) {
                              iVar62 = local_160.rank_.super__Vector_base<int,_std::allocator<int>_>
                                       ._M_impl.super__Vector_impl_data._M_start[(long)local_2b8];
                            }
                          }
                        }
                      }
                    }
                    if (iVar62 < iVar29) {
                      S2LogMessage::S2LogMessage
                                ((S2LogMessage *)local_258,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2boolean_operation.cc"
                                 ,0x293,kFatal,(ostream *)&std::cerr);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_258._8_8_,"Check failed: (lo) <= (hi) ",0x1b);
                      goto LAB_001a233c;
                    }
                    uVar30 = (pIVar38->allocator_and_tag_).tag_.size_;
                    if ((uVar30 & 1) != 0) {
                      pRVar54 = *(Rep **)((long)&pIVar38->rep_ + 8);
                    }
                    if (1 < uVar30) {
                      pvVar56 = (vector<int,_std::allocator<int>_> *)0xffffffff;
                      lVar47 = 0;
                      do {
                        iVar40 = (*(byte *)((long)pRVar54 + lVar47 + 8) ^ 1) +
                                 piVar19[*(int *)((long)pRVar54 + lVar47)];
                        if (((iVar29 <= iVar40) && (iVar40 <= iVar62)) &&
                           ((uVar46 = *(uint *)((long)pRVar54 + lVar47 + 4), (int)pvVar56 < 0 ||
                            (*(int *)(local_2a8._0_8_ + (long)(int)uVar46 * 4) <
                             *(int *)(local_2a8._0_8_ + (long)pvVar56 * 4))))) {
                          pvVar56 = (vector<int,_std::allocator<int>_> *)(ulong)uVar46;
                        }
                        lVar47 = lVar47 + 0x10;
                      } while ((uVar30 >> 1) * 0x10 != lVar47);
                      goto LAB_001a162a;
                    }
                  }
                  S2LogMessage::S2LogMessage
                            ((S2LogMessage *)local_258,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2boolean_operation.cc"
                             ,0x1ba,kFatal,(ostream *)&std::cerr);
                  std::operator<<((ostream *)local_258._8_8_,"Failed to get crossed vertex index.");
                  goto LAB_001a233c;
                }
LAB_001a1633:
                if (s2builder_verbose == false) {
                  pvVar48 = pvVar56;
                  pGVar51 = (pointer)local_318._0_8_;
                }
                else {
                  local_358 = pvVar56;
                  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
                  std::ostream::put('P');
                  poVar27 = (ostream *)std::ostream::flush();
                  std::__ostream_insert<char,std::char_traits<char>>(poVar27,"  ",2);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar27,"b input edge ",0xd);
                  pGVar51 = (pointer)local_318._0_8_;
                  poVar27 = (ostream *)
                            std::ostream::operator<<
                                      (poVar27,(int)(&((GraphOptions *)local_318._0_8_)->edge_type_)
                                                    [uVar33] >> 1);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar27," (l2r=",6);
                  poVar27 = std::ostream::_M_insert<bool>(SUB81(poVar27,0));
                  std::__ostream_insert<char,std::char_traits<char>>(poVar27,", crossing=",0xb);
                  pvVar56 = (vector<int,_std::allocator<int>_> *)((ulong)local_358 & 0xffffffff);
                  poVar27 = (ostream *)
                            std::ostream::operator<<
                                      (poVar27,*(int *)(local_2a8._0_8_ + (long)pvVar56 * 4));
                  std::__ostream_insert<char,std::char_traits<char>>(poVar27,")",1);
                  uVar30 = ((AllocatorAndTag *)local_2d8._0_8_)[(long)local_338].tag_.size_;
                  if ((uVar30 & 1) == 0) {
                    lVar47 = (long)(local_2d8._0_8_ + 8) + (long)local_338 * 8;
                  }
                  else {
                    lVar47 = *(long *)((long)(local_2d8._0_8_ + 8) + (long)local_338 * 8 + 8);
                  }
                  pvVar48 = local_358;
                  local_328 = pvVar56;
                  if (1 < uVar30) {
                    local_360 = (pair<int,_int> *)CONCAT71(local_360._1_7_,uVar39);
                    local_338 = pGVar51;
                    lVar50 = 0;
                    local_330 = uVar33;
                    do {
                      iVar29 = *(int *)(lVar47 + lVar50);
                      ppVar17 = ((local_160.g_)->edges_->
                                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                )._M_impl.super__Vector_impl_data._M_start;
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout," (",2);
                      poVar27 = (ostream *)
                                std::ostream::operator<<(&std::cout,ppVar17[iVar29].first);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar27,", ",2);
                      poVar27 = (ostream *)std::ostream::operator<<(poVar27,ppVar17[iVar29].second);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar27,")",1);
                      lVar50 = lVar50 + 0x10;
                    } while ((uVar30 >> 1) * 0x10 != lVar50);
                    pvVar56 = local_328;
                    pvVar48 = local_358;
                    uVar33 = local_330;
                    pGVar51 = local_338;
                    uVar39 = local_360._0_1_;
                  }
                }
                uVar46 = ((byte)(uVar39 ^ (undefined1)local_88) & 1) - 1 | 1;
                if (((local_160.input_dimensions_)->
                    super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
                    super__Vector_impl_data._M_start
                    [(int)(&(pGVar51->options_).edge_type_)[uVar33] >> 1] == '\x01') {
                  uVar46 = 0;
                }
                local_78[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[(long)pvVar56] =
                     local_78[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[(long)pvVar56] + uVar46;
                *(ulong *)(local_1c8._0_8_ + ((ulong)pvVar48 >> 6 & 0x3ffffff) * 8) =
                     *(ulong *)(local_1c8._0_8_ + ((ulong)pvVar48 >> 6 & 0x3ffffff) * 8) |
                     1L << ((byte)pvVar56 & 0x3f);
                uVar33 = uVar33 + 1;
              } while (uVar33 < (ulong)(local_318._8_8_ - (long)pGVar51 >> 2));
              if (s2builder_verbose != false) {
                std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
                std::ostream::put('P');
                std::ostream::flush();
              }
              local_368 = (CrossingInputEdge)
                          ((uint)(bVar15 & 1) +
                          *local_78[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start);
              pVar18 = (pair<int,_int>)local_2a8._0_8_;
              pVar32 = (pair<int,_int>)local_2a8._8_8_;
              local_338 = pGVar51;
              if (4 < (ulong)(local_2a8._8_8_ - local_2a8._0_8_)) {
                uVar33 = 1;
                do {
                  if (local_368 != (CrossingInputEdge)0x0) {
                    bVar15 = (byte)uVar33 & 0x3f;
                    *(ulong *)(local_1c8._0_8_ + (uVar33 >> 6 & 0x3ffffff) * 8) =
                         *(ulong *)(local_1c8._0_8_ + (uVar33 >> 6 & 0x3ffffff) * 8) &
                         (-2L << bVar15 | 0xfffffffffffffffeU >> 0x40 - bVar15);
                    uVar30 = uVar33 - 1;
                    bVar15 = (byte)uVar30 & 0x3f;
                    *(ulong *)(local_1c8._0_8_ +
                              ((uVar30 >> 6 & 0x3ffffff) +
                              ((ulong)((uVar30 & 0x800000000000003f) < 0x8000000000000001) - 1)) * 8
                              ) = *(ulong *)(local_1c8._0_8_ +
                                            ((uVar30 >> 6 & 0x3ffffff) +
                                            ((ulong)((uVar30 & 0x800000000000003f) <
                                                    0x8000000000000001) - 1)) * 8) &
                                  (-2L << bVar15 | 0xfffffffffffffffeU >> 0x40 - bVar15);
                  }
                  CVar36 = (CrossingInputEdge)-(int)local_368;
                  if ((local_1d8 & 1) == 0) {
                    CVar36 = local_368;
                  }
                  CVar41 = CVar36;
                  if (0 < (int)CVar36) {
                    do {
                      pVar18 = *(pair<int,_int> *)(local_2a8._0_8_ + -4 + uVar33 * 4);
                      local_258._0_4_ = pVar18.first;
                      local_258._4_4_ = pVar18.second;
                      local_364 = (int)local_348;
                      iVar4._M_current = *(pair<int,_int> **)((long)local_160.new_edges_ + 8);
                      if (iVar4._M_current ==
                          *(pair<int,_int> **)((long)local_160.new_edges_ + 0x10)) {
                        std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
                        _M_realloc_insert<std::pair<int,int>const&>
                                  ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
                                   local_160.new_edges_,iVar4,(pair<int,_int> *)local_258);
                      }
                      else {
                        *iVar4._M_current = pVar18;
                        *(long *)((long)local_160.new_edges_ + 8) =
                             *(long *)((long)local_160.new_edges_ + 8) + 8;
                      }
                      iVar5._M_current = *(int **)((long)local_160.new_input_edge_ids_ + 8);
                      if (iVar5._M_current == *(int **)((long)local_160.new_input_edge_ids_ + 0x10))
                      {
                        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                                  ((vector<int,std::allocator<int>> *)local_160.new_input_edge_ids_,
                                   iVar5,&local_364);
                      }
                      else {
                        *iVar5._M_current = (int)local_348;
                        *(int **)((long)local_160.new_input_edge_ids_ + 8) = iVar5._M_current + 1;
                      }
                      CVar41 = (CrossingInputEdge)((int)CVar41 + -1);
                    } while (CVar41 != (CrossingInputEdge)0x0);
                  }
                  if ((int)CVar36 < 0) {
                    do {
                      iVar29 = *(int *)(local_2a8._0_8_ + -4 + uVar33 * 4);
                      iVar62 = *(int *)(local_2a8._0_8_ + uVar33 * 4);
                      pVar25.second = iVar29;
                      pVar25.first = iVar62;
                      local_258._0_4_ = iVar62;
                      local_258._4_4_ = iVar29;
                      local_364 = (int)local_348;
                      iVar4._M_current = *(pair<int,_int> **)((long)local_160.new_edges_ + 8);
                      if (iVar4._M_current ==
                          *(pair<int,_int> **)((long)local_160.new_edges_ + 0x10)) {
                        std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
                        _M_realloc_insert<std::pair<int,int>const&>
                                  ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
                                   local_160.new_edges_,iVar4,(pair<int,_int> *)local_258);
                      }
                      else {
                        *iVar4._M_current = pVar25;
                        *(long *)((long)local_160.new_edges_ + 8) =
                             *(long *)((long)local_160.new_edges_ + 8) + 8;
                      }
                      iVar5._M_current = *(int **)((long)local_160.new_input_edge_ids_ + 8);
                      if (iVar5._M_current == *(int **)((long)local_160.new_input_edge_ids_ + 0x10))
                      {
                        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                                  ((vector<int,std::allocator<int>> *)local_160.new_input_edge_ids_,
                                   iVar5,&local_364);
                      }
                      else {
                        *iVar5._M_current = (int)local_348;
                        *(int **)((long)local_160.new_input_edge_ids_ + 8) = iVar5._M_current + 1;
                      }
                      CVar36 = (CrossingInputEdge)((int)CVar36 + 1);
                    } while (CVar36 != (CrossingInputEdge)0x0);
                  }
                  local_368 = (CrossingInputEdge)
                              ((int)local_368 +
                              local_78[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start[uVar33]);
                  uVar33 = uVar33 + 1;
                  pVar18 = (pair<int,_int>)local_2a8._0_8_;
                  pVar32 = (pair<int,_int>)local_2a8._8_8_;
                } while (uVar33 < (ulong)((long)(local_2a8._8_8_ - local_2a8._0_8_) >> 2));
              }
              if (1 < (uint)local_368) {
                S2LogMessage::S2LogMessage
                          ((S2LogMessage *)local_258,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2boolean_operation.cc"
                           ,0x1d6,kFatal,(ostream *)&std::cerr);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_258._8_8_,
                           "Check failed: multiplicity == 0 || multiplicity == 1 ",0x35);
                goto LAB_001a233c;
              }
              ppVar45 = local_1e8;
              pGVar51 = local_338;
              if ((pVar32 != pVar18) &&
                 (((local_160.input_dimensions_)->
                  super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
                  super__Vector_impl_data._M_start[local_80] != '\0')) {
                uVar33 = 0;
                do {
                  if ((*(ulong *)(local_1c8._0_8_ + (uVar33 >> 6 & 0x3ffffff) * 8) >>
                       (uVar33 & 0x3f) & 1) != 0) {
                    iVar29 = *(int *)((long)pVar18 + uVar33 * 4);
                    pVar26.second = iVar29;
                    pVar26.first = iVar29;
                    local_258._0_4_ = iVar29;
                    local_258._4_4_ = iVar29;
                    local_364 = (int)local_348;
                    iVar4._M_current = *(pair<int,_int> **)((long)local_160.new_edges_ + 8);
                    if (iVar4._M_current == *(pair<int,_int> **)((long)local_160.new_edges_ + 0x10))
                    {
                      std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
                      _M_realloc_insert<std::pair<int,int>const&>
                                ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
                                 local_160.new_edges_,iVar4,(pair<int,_int> *)local_258);
                    }
                    else {
                      *iVar4._M_current = pVar26;
                      *(long *)((long)local_160.new_edges_ + 8) =
                           *(long *)((long)local_160.new_edges_ + 8) + 8;
                    }
                    iVar5._M_current = *(int **)((long)local_160.new_input_edge_ids_ + 8);
                    if (iVar5._M_current == *(int **)((long)local_160.new_input_edge_ids_ + 0x10)) {
                      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                                ((vector<int,std::allocator<int>> *)local_160.new_input_edge_ids_,
                                 iVar5,&local_364);
                    }
                    else {
                      *iVar5._M_current = (int)local_348;
                      *(int **)((long)local_160.new_input_edge_ids_ + 8) = iVar5._M_current + 1;
                    }
                    pVar18 = (pair<int,_int>)local_2a8._0_8_;
                    pVar32 = (pair<int,_int>)local_2a8._8_8_;
                  }
                  uVar33 = uVar33 + 1;
                  ppVar45 = local_1e8;
                  pGVar51 = local_338;
                } while (uVar33 < (ulong)((long)pVar32 - (long)pVar18 >> 2));
              }
            }
            local_34c = local_34c + 1;
            uVar33 = (ulong)local_34c;
          } while (uVar33 < (ulong)((long)local_160.order_.
                                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                          super__Vector_impl_data._M_finish -
                                    (long)local_160.order_.
                                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                          super__Vector_impl_data._M_start >> 2));
          std::
          vector<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>,_std::allocator<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>_>_>
          ::~vector((vector<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>,_std::allocator<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>_>_>
                     *)local_2d8);
          if (pGVar51 != (pointer)0x0) {
            operator_delete(pGVar51);
          }
        }
        if ((_Bit_type *)local_1c8._0_8_ != (_Bit_type *)0x0) {
          operator_delete((void *)local_1c8._0_8_);
        }
        if (local_78[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_78[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if ((pair<int,_int>)local_2a8._0_8_ != (pair<int,_int>)0x0) {
          operator_delete((void *)local_2a8._0_8_);
        }
        if (local_160.rank_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_160.rank_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if (local_160.order_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_160.order_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if (local_160.out_.edge_begins_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_160.out_.edge_begins_.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
        }
        if (local_160.in_.in_edge_begins_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_160.in_.in_edge_begins_.
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if (local_160.in_.in_edge_ids_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_160.in_.in_edge_ids_.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
        }
        if (s2builder_verbose == true) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Edges after clipping: ",0x16);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
          std::ostream::put('P');
          std::ostream::flush();
          if (local_2f8.
              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl
              .super__Vector_impl_data._M_finish !=
              local_2f8.
              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl
              .super__Vector_impl_data._M_start) {
            uVar33 = 0;
            do {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  ",2);
              poVar27 = (ostream *)
                        std::ostream::operator<<
                                  (&std::cout,
                                   local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start[uVar33]);
              std::__ostream_insert<char,std::char_traits<char>>(poVar27," (",2);
              poVar27 = (ostream *)
                        std::ostream::operator<<
                                  (poVar27,local_2f8.
                                           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start[uVar33].first);
              std::__ostream_insert<char,std::char_traits<char>>(poVar27,", ",2);
              poVar27 = (ostream *)
                        std::ostream::operator<<
                                  (poVar27,local_2f8.
                                           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start[uVar33].second)
              ;
              std::__ostream_insert<char,std::char_traits<char>>(poVar27,")",1);
              std::ios::widen((char)poVar27->_vptr_basic_ostream[-3] + (char)poVar27);
              std::ostream::put((char)poVar27);
              std::ostream::flush();
              uVar33 = uVar33 + 1;
            } while (uVar33 < (ulong)((long)local_2f8.
                                            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)local_2f8.
                                            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start >> 3));
          }
        }
        IdSetLexicon::IdSetLexicon((IdSetLexicon *)&local_160);
        puVar7 = (local_2c0->layers_->
                 super__Vector_base<std::unique_ptr<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_>,_std::allocator<std::unique_ptr<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        lVar47 = (long)(local_2c0->layers_->
                       super__Vector_base<std::unique_ptr<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_>,_std::allocator<std::unique_ptr<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish - (long)puVar7 >> 3;
        if (lVar47 == 1) {
          (**(code **)(*(long *)(puVar7->_M_t).
                                super___uniq_ptr_impl<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_>
                                ._M_t + 0x10))(local_258);
          pSVar13 = local_1e0;
          MakeGraph((Graph *)local_1c8,local_a8,(GraphOptions *)local_258,&local_2f8,&local_208,
                    (IdSetLexicon *)&local_160,local_1e0);
          _Var8._M_t.
          super__Tuple_impl<0UL,_S2Builder::Layer_*,_std::default_delete<S2Builder::Layer>_>.
          super__Head_base<0UL,_S2Builder::Layer_*,_false>._M_head_impl =
               (((local_2c0->layers_->
                 super__Vector_base<std::unique_ptr<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_>,_std::allocator<std::unique_ptr<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start)->_M_t).
               super___uniq_ptr_impl<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_>._M_t;
          (**(code **)(*(long *)_Var8._M_t.
                                super__Tuple_impl<0UL,_S2Builder::Layer_*,_std::default_delete<S2Builder::Layer>_>
                                .super__Head_base<0UL,_S2Builder::Layer_*,_false>._M_head_impl +
                      0x18))(_Var8._M_t.
                             super__Tuple_impl<0UL,_S2Builder::Layer_*,_std::default_delete<S2Builder::Layer>_>
                             .super__Head_base<0UL,_S2Builder::Layer_*,_false>._M_head_impl,
                             local_1c8,pSVar13);
          if (local_170 != (_Manager_type)0x0) {
            (*local_170)(&local_180,&local_180,__destroy_functor);
          }
        }
        else {
          if (lVar47 != 3) {
            S2LogMessage::S2LogMessage
                      ((S2LogMessage *)local_1c8,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2boolean_operation.cc"
                       ,0x30a,kFatal,(ostream *)&std::cerr);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1c8._8_8_,"Check failed: (3) == (layers_.size()) ",0x26);
            goto LAB_001a233c;
          }
          local_228 = (undefined1  [16])0x0;
          local_238 = (undefined1  [16])0x0;
          local_248 = (undefined1  [16])0x0;
          local_258._0_4_ = kInfo;
          local_258._4_4_ = 0;
          local_258._8_8_ = (ostream *)0x0;
          lVar47 = 0;
          local_218 = 0;
          local_268 = 0;
          local_278 = (undefined1  [16])0x0;
          local_288 = (undefined1  [16])0x0;
          local_298 = (undefined1  [16])0x0;
          local_2a8._0_4_ = kInfo;
          local_2a8._4_4_ = 0;
          local_2a8._8_8_ = (ostream *)0x0;
          do {
            *(undefined8 *)
             ((long)&local_78[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start + lVar47) = 0x200000000;
            *(undefined8 *)
             ((long)&local_78[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish + lVar47) = 0x200000001;
            *(undefined1 *)
             ((long)&local_78[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + lVar47) = 1;
            lVar47 = lVar47 + 0x14;
          } while (lVar47 != 0x3c);
          local_318 = (undefined1  [16])0x0;
          local_308 = (pointer)0x0;
          std::vector<S2Builder::Graph,_std::allocator<S2Builder::Graph>_>::reserve
                    ((vector<S2Builder::Graph,_std::allocator<S2Builder::Graph>_> *)local_318,3);
          ppVar17 = local_2f8.
                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          if (local_2f8.
              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl
              .super__Vector_impl_data._M_finish !=
              local_2f8.
              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl
              .super__Vector_impl_data._M_start) {
            lVar47 = 0;
            lVar50 = 0;
            uVar33 = 0;
            do {
              lVar28 = (long)(local_2c0->input_dimensions_->
                             super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
                             super__Vector_impl_data._M_start
                             [*(int *)((long)local_208.super__Vector_base<int,_std::allocator<int>_>
                                             ._M_impl.super__Vector_impl_data._M_start + lVar50)];
              lVar24 = lVar28 * 0x18;
              ppVar34 = (pair<int,_int> *)
                        ((long)&(local_2f8.
                                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->first + lVar47);
              iVar4._M_current = *(pair<int,_int> **)(local_258 + lVar24 + 8);
              if (iVar4._M_current == *(pair<int,_int> **)(local_248 + lVar24)) {
                std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
                _M_realloc_insert<std::pair<int,int>const&>
                          ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
                           (local_258 + lVar24),iVar4,ppVar34);
              }
              else {
                *iVar4._M_current = *ppVar34;
                *(long *)(local_258 + lVar24 + 8) = *(long *)(local_258 + lVar24 + 8) + 8;
              }
              lVar28 = lVar28 * 0x18;
              iVar5._M_current = *(int **)(local_2a8 + lVar28 + 8);
              if (iVar5._M_current == *(int **)(local_298 + lVar28)) {
                std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                          ((vector<int,std::allocator<int>> *)(local_2a8 + lVar28),iVar5,
                           (int *)((long)local_208.super__Vector_base<int,_std::allocator<int>_>.
                                         _M_impl.super__Vector_impl_data._M_start + lVar50));
              }
              else {
                *iVar5._M_current =
                     *(int *)((long)local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start + lVar50);
                *(int **)(local_2a8 + lVar28 + 8) = iVar5._M_current + 1;
              }
              uVar33 = uVar33 + 1;
              lVar50 = lVar50 + 4;
              lVar47 = lVar47 + 8;
              ppVar17 = local_2f8.
                        super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
            } while (uVar33 < (ulong)((long)local_2f8.
                                            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)local_2f8.
                                            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start >> 3));
          }
          local_2f8.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_2f8.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_2f8.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          if (ppVar17 != (pointer)0x0) {
            operator_delete(ppVar17);
          }
          piVar19 = local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)0x0;
          local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)0x0;
          local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)0x0;
          if (piVar19 != (pointer)0x0) {
            operator_delete(piVar19);
          }
          options = (GraphOptions *)local_78;
          lVar47 = 0;
          lVar50 = 0;
          do {
            (**(code **)(*(long *)(local_2c0->layers_->
                                  super__Vector_base<std::unique_ptr<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_>,_std::allocator<std::unique_ptr<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start[lVar50]._M_t.
                                  super___uniq_ptr_impl<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_>
                                  ._M_t + 0x10))((Graph *)local_1c8);
            auVar60 = local_1c8;
            options->allow_vertex_filtering_ = local_1b8._0_1_;
            options->edge_type_ = local_1c8._0_4_;
            options->degenerate_edges_ = local_1c8._4_4_;
            options->duplicate_edges_ = local_1c8._8_4_;
            options->sibling_pairs_ = local_1c8._12_4_;
            local_1c8 = auVar60;
            MakeGraph((Graph *)local_1c8,local_a8,options,
                      (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)local_98
                      ,(vector<int,_std::allocator<int>_> *)local_a0,(IdSetLexicon *)&local_160,
                      local_1e0);
            std::vector<S2Builder::Graph,_std::allocator<S2Builder::Graph>_>::
            emplace_back<S2Builder::Graph>
                      ((vector<S2Builder::Graph,_std::allocator<S2Builder::Graph>_> *)local_318,
                       (Graph *)local_1c8);
            if (local_170 != (_Manager_type)0x0) {
              (*local_170)(&local_180,&local_180,__destroy_functor);
            }
            _Var8._M_t.
            super__Tuple_impl<0UL,_S2Builder::Layer_*,_std::default_delete<S2Builder::Layer>_>.
            super__Head_base<0UL,_S2Builder::Layer_*,_false>._M_head_impl =
                 (local_2c0->layers_->
                 super__Vector_base<std::unique_ptr<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_>,_std::allocator<std::unique_ptr<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start[lVar50]._M_t.
                 super___uniq_ptr_impl<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_>.
                 _M_t;
            (**(code **)(*(long *)_Var8._M_t.
                                  super__Tuple_impl<0UL,_S2Builder::Layer_*,_std::default_delete<S2Builder::Layer>_>
                                  .super__Head_base<0UL,_S2Builder::Layer_*,_false>._M_head_impl +
                        0x18))(_Var8._M_t.
                               super__Tuple_impl<0UL,_S2Builder::Layer_*,_std::default_delete<S2Builder::Layer>_>
                               .super__Head_base<0UL,_S2Builder::Layer_*,_false>._M_head_impl,
                               (undefined1 *)
                               ((long)&((GraphOptions *)local_318._0_8_)->edge_type_ + lVar47),
                               local_1e0);
            lVar50 = lVar50 + 1;
            local_a0 = local_a0 + 0x18;
            local_98 = local_98 + 1;
            options = options + 1;
            lVar47 = lVar47 + 0x68;
          } while (lVar50 != 3);
          std::vector<S2Builder::Graph,_std::allocator<S2Builder::Graph>_>::~vector
                    ((vector<S2Builder::Graph,_std::allocator<S2Builder::Graph>_> *)local_318);
          lVar47 = 0x30;
          do {
            if (*(void **)(local_2a8 + lVar47) != (void *)0x0) {
              operator_delete(*(void **)(local_2a8 + lVar47));
            }
            lVar47 = lVar47 + -0x18;
          } while (lVar47 != -0x18);
          lVar47 = 0x30;
          do {
            if (*(void **)(local_258 + lVar47) != (void *)0x0) {
              operator_delete(*(void **)(local_258 + lVar47));
            }
            lVar47 = lVar47 + -0x18;
          } while (lVar47 != -0x18);
        }
        IdSetLexicon::~IdSetLexicon((IdSetLexicon *)&local_160);
        if (local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != (pointer)0x0) {
          operator_delete(local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if (local_2f8.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_2f8.
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        return;
      }
      S2LogMessage::S2LogMessage
                ((S2LogMessage *)local_1c8,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2boolean_operation.cc"
                 ,0xc1,kFatal,(ostream *)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1c8._8_8_,
                 "Check failed: g.options().sibling_pairs() == SiblingPairs::KEEP ",0x40);
    }
    else {
      S2LogMessage::S2LogMessage
                ((S2LogMessage *)local_1c8,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2boolean_operation.cc"
                 ,0xc0,kFatal,(ostream *)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1c8._8_8_,
                 "Check failed: g.options().duplicate_edges() == DuplicateEdges::KEEP ",0x44);
    }
  }
  else {
    S2LogMessage::S2LogMessage
              ((S2LogMessage *)local_1c8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2boolean_operation.cc"
               ,0xbf,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c8._8_8_,
               "Check failed: g.options().edge_type() == EdgeType::DIRECTED ",0x3c);
  }
LAB_001a233c:
  abort();
}

Assistant:

void EdgeClippingLayer::Build(const Graph& g, S2Error* error) {
  // The bulk of the work is handled by GraphEdgeClipper.
  vector<Graph::Edge> new_edges;
  vector<InputEdgeIdSetId> new_input_edge_ids;
  // Destroy the GraphEdgeClipper immediately to save memory.
  GraphEdgeClipper(g, input_dimensions_, input_crossings_,
                   &new_edges, &new_input_edge_ids).Run();
  if (s2builder_verbose) {
    std::cout << "Edges after clipping: " << std::endl;
    for (int i = 0; i < new_edges.size(); ++i) {
      std::cout << "  " << new_input_edge_ids[i] << " (" << new_edges[i].first
                << ", " << new_edges[i].second << ")" << std::endl;
    }
  }
  // Construct one or more graphs from the clipped edges and pass them to the
  // given output layer(s).
  IdSetLexicon new_input_edge_id_set_lexicon;
  if (layers_.size() == 1) {
    GraphOptions options = layers_[0]->graph_options();
    Graph new_graph = MakeGraph(g, &options, &new_edges, &new_input_edge_ids,
                                &new_input_edge_id_set_lexicon, error);
    layers_[0]->Build(new_graph, error);
  } else {
    // The Graph objects must be valid until the last Build() call completes,
    // so we store all of the graph data in arrays with 3 elements.
    S2_DCHECK_EQ(3, layers_.size());
    vector<Graph::Edge> layer_edges[3];
    vector<InputEdgeIdSetId> layer_input_edge_ids[3];
    S2Builder::GraphOptions layer_options[3];
    vector<S2Builder::Graph> layer_graphs;  // No default constructor.
    layer_graphs.reserve(3);
    // Separate the edges according to their dimension.
    for (int i = 0; i < new_edges.size(); ++i) {
      int d = input_dimensions_[new_input_edge_ids[i]];
      layer_edges[d].push_back(new_edges[i]);
      layer_input_edge_ids[d].push_back(new_input_edge_ids[i]);
    }
    // Clear variables to save space.
    vector<Graph::Edge>().swap(new_edges);
    vector<InputEdgeIdSetId>().swap(new_input_edge_ids);
    for (int d = 0; d < 3; ++d) {
      layer_options[d] = layers_[d]->graph_options();
      layer_graphs.push_back(MakeGraph(
          g, &layer_options[d], &layer_edges[d], &layer_input_edge_ids[d],
          &new_input_edge_id_set_lexicon, error));
      layers_[d]->Build(layer_graphs[d], error);
    }
  }
}